

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

void __thiscall duckdb::AsOfLocalState::~AsOfLocalState(AsOfLocalState *this)

{
  (this->super_CachingOperatorState).super_OperatorState._vptr_OperatorState =
       (_func_int **)&PTR__AsOfLocalState_027ba380;
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            (&(this->left_outer).found_match.super_unique_ptr<bool[],_std::default_delete<bool[]>_>)
  ;
  DataChunk::~DataChunk(&this->lhs_payload);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->lhs_sel).selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->lhs_valid_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.
              internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  DataChunk::~DataChunk(&this->lhs_keys);
  ExpressionExecutor::~ExpressionExecutor(&this->lhs_executor);
  CachingOperatorState::~CachingOperatorState(&this->super_CachingOperatorState);
  return;
}

Assistant:

AsOfLocalState(ClientContext &context, const PhysicalAsOfJoin &op)
	    : context(context), allocator(Allocator::Get(context)), op(op), lhs_executor(context),
	      left_outer(IsLeftOuterJoin(op.join_type)), fetch_next_left(true) {
		lhs_keys.Initialize(allocator, op.join_key_types);
		for (const auto &cond : op.conditions) {
			lhs_executor.AddExpression(*cond.left);
		}

		lhs_payload.Initialize(allocator, op.children[0].get().GetTypes());
		lhs_sel.Initialize();
		left_outer.Initialize(STANDARD_VECTOR_SIZE);

		auto &gsink = op.sink_state->Cast<AsOfGlobalSinkState>();
		lhs_partition_sink = gsink.RegisterBuffer(context);
	}